

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O0

void helper_mttc0_status_mips64el(CPUMIPSState_conflict5 *env,target_ulong arg1)

{
  CPUMIPSState_conflict5 *cpu;
  CPUMIPSState_conflict5 *other;
  uint32_t mask;
  int other_tc;
  target_ulong arg1_local;
  CPUMIPSState_conflict5 *env_local;
  
  other._4_4_ = env->CP0_VPEControl & 0xff;
  other._0_4_ = env->CP0_Status_rw_bitmask & 0xeffffe7;
  _mask = arg1;
  arg1_local = (target_ulong)env;
  cpu = mips_cpu_map_tc(env,(int *)((long)&other + 4));
  cpu->CP0_Status = cpu->CP0_Status & ((uint)other ^ 0xffffffff) | (uint)_mask & (uint)other;
  sync_c0_status_mips64el((CPUMIPSState_conflict5 *)arg1_local,cpu,other._4_4_);
  return;
}

Assistant:

void helper_mttc0_status(CPUMIPSState *env, target_ulong arg1)
{
    int other_tc = env->CP0_VPEControl & (0xff << CP0VPECo_TargTC);
    uint32_t mask = env->CP0_Status_rw_bitmask & ~0xf1000018;
    CPUMIPSState *other = mips_cpu_map_tc(env, &other_tc);

    other->CP0_Status = (other->CP0_Status & ~mask) | (arg1 & mask);
    sync_c0_status(env, other, other_tc);
}